

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

uint32_t trico_get_number_of_normals(void *a)

{
  int iVar1;
  uint32_t local_24;
  void *pvStack_20;
  uint32_t nr_normals;
  trico_archive *arch;
  void *a_local;
  
  if ((((*(int *)((long)a + 0x24) == 9) || (*(int *)((long)a + 0x24) == 10)) ||
      (*(int *)((long)a + 0x24) == 0xb)) || (*(int *)((long)a + 0x24) == 0xc)) {
    pvStack_20 = a;
    arch = (trico_archive *)a;
    iVar1 = read_inplace(&local_24,4,1,(trico_archive *)a);
    if (iVar1 == 0) {
      a_local._4_4_ = 0;
    }
    else {
      a_local._4_4_ = local_24;
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

uint32_t trico_get_number_of_normals(void* a)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (arch->next_stream_type == trico_vertex_normal_float_stream || arch->next_stream_type == trico_vertex_normal_double_stream ||
    arch->next_stream_type == trico_triangle_normal_float_stream || arch->next_stream_type == trico_triangle_normal_double_stream
    )
    {
    uint32_t nr_normals;
    if (!read_inplace(&nr_normals, sizeof(uint32_t), 1, arch))
      return 0;
    return nr_normals;
    }
  return 0;
  }